

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

Clump * rw::Clump::streamRead(Stream *stream)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int32 iVar5;
  Clump *this;
  FrameList_ *pFVar6;
  Geometry **geometryList;
  Atomic *pAVar7;
  Geometry *pGVar8;
  Light *this_00;
  Camera *this_01;
  int iVar9;
  Clump *this_02;
  ulong uVar10;
  uint32 version;
  FrameList_ frmlst;
  uint32 length;
  int32 buf [3];
  uint local_54;
  FrameList_ local_50;
  uint32 local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  bVar2 = findChunk(stream,1,&local_40,&local_54);
  if (!bVar2) {
    streamRead();
    return (Clump *)0x0;
  }
  Stream::read32(stream,&local_3c,local_40);
  uVar1 = local_54;
  this = create();
  if (this == (Clump *)0x0) {
    return (Clump *)0x0;
  }
  local_50.frames = (Frame **)0x0;
  bVar2 = findChunk(stream,0xe,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar2) {
    streamRead();
    goto LAB_0012eaf8;
  }
  pFVar6 = FrameList_::streamRead(&local_50,stream);
  if (pFVar6 == (FrameList_ *)0x0) goto LAB_0012eaf8;
  (this->object).parent = *local_50.frames;
  if (local_54 < 0x30400) {
    geometryList = (Geometry **)0x0;
    uVar4 = 0;
LAB_0012e6f7:
    bVar2 = 0 < local_3c;
    if (0 < local_3c) {
      iVar9 = 1;
      do {
        bVar3 = findChunk(stream,0x14,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar3) {
          streamRead();
LAB_0012e82c:
          if (bVar2) goto LAB_0012eaca;
          break;
        }
        pAVar7 = Atomic::streamReadClump(stream,&local_50,geometryList);
        if (pAVar7 == (Atomic *)0x0) goto LAB_0012e82c;
        pAVar7->clump = this;
        (pAVar7->inClump).next = &(this->atomics).link;
        (pAVar7->inClump).prev = (this->atomics).link.prev;
        ((this->atomics).link.prev)->next = &pAVar7->inClump;
        (this->atomics).link.prev = &pAVar7->inClump;
        bVar2 = iVar9 < local_3c;
        bVar3 = iVar9 != local_3c;
        iVar9 = iVar9 + 1;
      } while (bVar3);
    }
    iVar9 = 0x18;
    if (0 < local_38 && 0x33000 < uVar1) {
      iVar9 = 1;
      do {
        bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          streamRead();
LAB_0012e91b:
          iVar9 = 0x12;
          goto LAB_0012e920;
        }
        iVar5 = Stream::readI32(stream);
        bVar2 = findChunk(stream,0x12,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          streamRead();
          goto LAB_0012e91b;
        }
        this_00 = Light::streamRead(stream);
        if (this_00 == (Light *)0x0) goto LAB_0012e91b;
        ObjectWithFrame::setFrame(&this_00->object,local_50.frames[iVar5]);
        this_00->clump = this;
        (this_00->inClump).next = &(this->lights).link;
        (this_00->inClump).prev = (this->lights).link.prev;
        ((this->lights).link.prev)->next = &this_00->inClump;
        (this->lights).link.prev = &this_00->inClump;
      } while ((0x33000 < uVar1) && (bVar2 = iVar9 < local_38, iVar9 = iVar9 + 1, bVar2));
      iVar9 = 0x18;
    }
LAB_0012e920:
    if (iVar9 != 0x12) {
      if (iVar9 != 0x18) {
        return this;
      }
      iVar9 = 0x1f;
      if (0 < local_34 && 0x33000 < uVar1) {
        iVar9 = 1;
        do {
          bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar2) {
            streamRead();
LAB_0012ea5a:
            iVar9 = 0x12;
            goto LAB_0012ea68;
          }
          iVar5 = Stream::readI32(stream);
          bVar2 = findChunk(stream,5,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar2) {
            streamRead();
            goto LAB_0012ea5a;
          }
          this_01 = Camera::streamRead(stream);
          if (this_01 == (Camera *)0x0) goto LAB_0012ea5a;
          ObjectWithFrame::setFrame(&this_01->object,local_50.frames[iVar5]);
          this_01->clump = this;
          (this_01->inClump).next = &(this->cameras).link;
          (this_01->inClump).prev = (this->cameras).link.prev;
          ((this->cameras).link.prev)->next = &this_01->inClump;
          (this->cameras).link.prev = &this_01->inClump;
        } while ((0x33000 < uVar1) && (bVar2 = iVar9 < local_34, iVar9 = iVar9 + 1, bVar2));
        iVar9 = 0x1f;
      }
LAB_0012ea68:
      if (iVar9 != 0x12) {
        if (iVar9 != 0x1f) {
          return this;
        }
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            if (geometryList[uVar10] != (Geometry *)0x0) {
              Geometry::destroy(geometryList[uVar10]);
            }
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        (*DAT_00148850)(geometryList);
        (*DAT_00148850)(local_50.frames);
        bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
        if (bVar2) {
          return this;
        }
      }
    }
  }
  else {
    bVar2 = findChunk(stream,0x1a,(uint32 *)0x0,(uint32 *)0x0);
    if (!bVar2) {
      streamRead();
      goto LAB_0012eaf8;
    }
    bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
    if (!bVar2) {
      streamRead();
      goto LAB_0012eaf8;
    }
    uVar4 = Stream::readI32(stream);
    if (uVar4 == 0) {
      geometryList = (Geometry **)0x0;
    }
    else {
      this_02 = (Clump *)((long)(int)uVar4 << 3);
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 198"
      ;
      geometryList = (Geometry **)(*Engine::memfuncs)(this_02);
      if (geometryList == (Geometry **)0x0) {
        streamRead(this_02);
        iVar9 = 6;
      }
      else {
        iVar9 = 0;
        memset(geometryList,0,(size_t)this_02);
      }
      if (iVar9 == 6) goto LAB_0012eaf8;
      if (iVar9 != 0) {
        return this;
      }
    }
    iVar9 = 0xd;
    if (0 < (int)uVar4) {
      uVar10 = 0;
      do {
        bVar2 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          streamRead();
LAB_0012ea2e:
          iVar9 = 0x12;
          break;
        }
        pGVar8 = Geometry::streamRead(stream);
        geometryList[uVar10] = pGVar8;
        if (pGVar8 == (Geometry *)0x0) goto LAB_0012ea2e;
        uVar10 = uVar10 + 1;
        iVar9 = 0xd;
      } while (uVar4 != uVar10);
    }
    if (iVar9 != 0x12) {
      if (iVar9 != 0xd) {
        return this;
      }
      goto LAB_0012e6f7;
    }
  }
LAB_0012eaca:
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      if (geometryList[uVar10] != (Geometry *)0x0) {
        Geometry::destroy(geometryList[uVar10]);
      }
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  (*DAT_00148850)(geometryList);
LAB_0012eaf8:
  (*DAT_00148850)(local_50.frames);
  destroy(this);
  return (Clump *)0x0;
}

Assistant:

Clump*
Clump::streamRead(Stream *stream)
{
	uint32 length, version;
	int32 buf[3];
	Clump *clump;
	int32 numGeometries;
	Geometry **geometryList;

	if(!findChunk(stream, ID_STRUCT, &length, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, length);
	int32 numAtomics = buf[0];
	int32 numLights = 0;
	int32 numCameras = 0;
	if(version > 0x33000){
		numLights = buf[1];
		numCameras = buf[2];
	}
	clump = Clump::create();
	if(clump == nil)
		return nil;

	// Frame list
	FrameList_ frmlst;
	frmlst.frames = nil;
	if(!findChunk(stream, ID_FRAMELIST, nil, nil)){
		RWERROR((ERR_CHUNK, "FRAMELIST"));
		goto fail;
	}
	if(frmlst.streamRead(stream) == nil)
		goto fail;
	clump->setFrame(frmlst.frames[0]);

	// Geometry list
	numGeometries = 0;
	geometryList = nil;
	if(version >= 0x30400){
		if(!findChunk(stream, ID_GEOMETRYLIST, nil, nil)){
			RWERROR((ERR_CHUNK, "GEOMETRYLIST"));
			goto fail;
		}
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		numGeometries = stream->readI32();
		if(numGeometries){
			size_t sz = numGeometries*sizeof(Geometry*);
			geometryList = (Geometry**)rwMalloc(sz, MEMDUR_FUNCTION | ID_CLUMP);
			if(geometryList == nil){
				RWERROR((ERR_ALLOC, sz));
				goto fail;
			}
			memset(geometryList, 0, sz);
		}
		for(int32 i = 0; i < numGeometries; i++){
			if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
				RWERROR((ERR_CHUNK, "GEOMETRY"));
				goto failgeo;
			}
			geometryList[i] = Geometry::streamRead(stream);
			if(geometryList[i] == nil)
				goto failgeo;
		}
	}

	// Atomics
	Atomic *a;
	for(int32 i = 0; i < numAtomics; i++){
		if(!findChunk(stream, ID_ATOMIC, nil, nil)){
			RWERROR((ERR_CHUNK, "ATOMIC"));
			goto failgeo;
		}
		a = Atomic::streamReadClump(stream, &frmlst, geometryList);
		if(a == nil)
			goto failgeo;
		clump->addAtomic(a);
	}

	// Lights
	int32 frm;
	Light *l;
	for(int32 i = 0; i < numLights; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_LIGHT, nil, nil)){
			RWERROR((ERR_CHUNK, "LIGHT"));
			goto failgeo;
		}
		l = Light::streamRead(stream);
		if(l == nil)
			goto failgeo;
		l->setFrame(frmlst.frames[frm]);
		clump->addLight(l);
	}

	// Cameras
	Camera *cam;
	for(int32 i = 0; i < numCameras; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_CAMERA, nil, nil)){
			RWERROR((ERR_CHUNK, "CAMERA"));
			goto failgeo;
		}
		cam = Camera::streamRead(stream);
		if(cam == nil)
			goto failgeo;
		cam->setFrame(frmlst.frames[frm]);
		clump->addCamera(cam);
	}

	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
	rwFree(frmlst.frames);
	if(s_plglist.streamRead(stream, clump))
		return clump;

failgeo:
	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
fail:
	rwFree(frmlst.frames);
	clump->destroy();
	return nil;
}